

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::StringAggState,duckdb::string_t,duckdb::StringAggFunction>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  string_t *input_00;
  long lVar1;
  ulong uVar2;
  FunctionData *pFVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  idx_t iVar13;
  ulong uVar14;
  AggregateUnaryInput input_data;
  undefined1 local_98 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  Vector *local_50;
  AggregateUnaryInput local_48;
  
  if (*input == (Vector)0x0) {
    lVar1 = *(long *)(input + 0x20);
    FlatVector::VerifyFlatVector(input);
    local_98._8_8_ = input + 0x28;
    local_98._16_8_ = 0;
    if (0x3f < count + 0x3f) {
      uVar12 = 0;
      uVar10 = 0;
      uVar9 = 0;
      local_98._0_8_ = aggr_input_data;
      local_50 = (Vector *)local_98._8_8_;
      do {
        if (*(long *)local_50 == 0) {
          uVar14 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar14 = count;
          }
joined_r0x0041d628:
          while (uVar8 = uVar12, uVar5 = uVar12, uVar6 = local_98._16_8_, uVar12 < uVar14) {
            StringAggFunction::
            Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                      ((StringAggState *)state,(string_t *)(uVar12 * 0x10 + lVar1),
                       (AggregateUnaryInput *)local_98);
            uVar12 = local_98._16_8_ + 1;
            local_98._16_8_ = uVar12;
          }
        }
        else {
          uVar2 = *(ulong *)(*(long *)local_50 + uVar10 * 8);
          uVar14 = uVar9 + 0x40;
          if (count <= uVar9 + 0x40) {
            uVar14 = count;
          }
          if (uVar2 == 0xffffffffffffffff) goto joined_r0x0041d628;
          uVar8 = uVar14;
          uVar5 = uVar14;
          uVar6 = uVar14;
          uVar7 = uVar9;
          uVar4 = local_98._16_8_;
          if (uVar2 != 0) {
            while (local_98._16_8_ = uVar7, uVar8 = local_98._16_8_, uVar5 = uVar12, uVar6 = uVar4,
                  (ulong)local_98._16_8_ < uVar14) {
              if ((uVar2 >> ((ulong)(uint)((int)local_98._16_8_ - (int)uVar9) & 0x3f) & 1) != 0) {
                lVar11 = local_98._16_8_ * 0x10;
                local_98._16_8_ = uVar4;
                StringAggFunction::
                Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                          ((StringAggState *)state,(string_t *)(lVar11 + lVar1),
                           (AggregateUnaryInput *)local_98);
              }
              uVar12 = local_98._16_8_ + 1;
              uVar4 = uVar12;
              uVar7 = uVar12;
            }
          }
        }
        local_98._16_8_ = uVar6;
        uVar12 = uVar5;
        uVar10 = uVar10 + 1;
        uVar9 = uVar8;
      } while (uVar10 != count + 0x3f >> 6);
    }
  }
  else if (*input == (Vector)0x2) {
    if ((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) {
      input_00 = *(string_t **)(input + 0x20);
      local_98._8_8_ = input + 0x28;
      local_98._16_8_ = 0;
      if (count != 0) {
        local_98._0_8_ = aggr_input_data;
        do {
          StringAggFunction::
          Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                    ((StringAggState *)state,input_00,(AggregateUnaryInput *)local_98);
          count = count - 1;
        } while (count != 0);
      }
    }
  }
  else {
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_98);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    local_48.input_mask = (ValidityMask *)(local_98 + 0x10);
    local_48.input = aggr_input_data;
    if (local_98._16_8_ == 0) {
      if (count != 0) {
        pFVar3 = ((optional_ptr<duckdb::FunctionData,_true> *)local_98._0_8_)->ptr;
        iVar13 = 0;
        do {
          local_48.input_idx = iVar13;
          if (pFVar3 != (FunctionData *)0x0) {
            local_48.input_idx = (idx_t)*(uint *)(pFVar3 + iVar13 * 4);
          }
          StringAggFunction::
          Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                    ((StringAggState *)state,
                     (string_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_98._8_8_)->validity_mask +
                     local_48.input_idx * 2),&local_48);
          iVar13 = iVar13 + 1;
        } while (count != iVar13);
      }
    }
    else if (count != 0) {
      pFVar3 = ((optional_ptr<duckdb::FunctionData,_true> *)local_98._0_8_)->ptr;
      iVar13 = 0;
      do {
        local_48.input_idx = iVar13;
        if (pFVar3 != (FunctionData *)0x0) {
          local_48.input_idx = (idx_t)*(uint *)(pFVar3 + iVar13 * 4);
        }
        if ((local_98._16_8_ == 0) ||
           ((*(ulong *)(local_98._16_8_ + (local_48.input_idx >> 6) * 8) >>
             (local_48.input_idx & 0x3f) & 1) != 0)) {
          StringAggFunction::
          Operation<duckdb::string_t,duckdb::StringAggState,duckdb::StringAggFunction>
                    ((StringAggState *)state,
                     (string_t *)
                     (&((TemplatedValidityMask<unsigned_long> *)local_98._8_8_)->validity_mask +
                     local_48.input_idx * 2),&local_48);
        }
        iVar13 = iVar13 + 1;
      } while (count != iVar13);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}